

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::create_connected_constraints
          (Proof *this,int p,int t,function<bool_(int,_int)> *adj)

{
  long *plVar1;
  Proof *pPVar2;
  pointer pbVar3;
  char cVar4;
  _Tuple_impl<2UL,_int> _Var5;
  uint uVar6;
  _Tuple_impl<2UL,_int> _Var7;
  uint uVar8;
  _Tuple_impl<1UL,_int,_int> _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  _Tuple_impl<1UL,_int,_int> _Var13;
  mapped_type *pmVar14;
  iterator iVar15;
  _Tuple_impl<1UL,_int,_int> _Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  _Head_base<2UL,_int,_false> _Var20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  long lVar21;
  _Tuple_impl<2UL,_int,_int> _Var22;
  pointer pbVar23;
  _Head_base<2UL,_int,_false> __val;
  _Tuple_impl<1UL,_int,_int> _Var24;
  ulong uVar25;
  undefined8 uVar26;
  uint uVar27;
  _Tuple_impl<1UL,_int,_int> _Var28;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var29;
  _Tuple_impl<1UL,_int,_int> _Var31;
  uint uVar32;
  _Tuple_impl<1UL,_int,_int> _Var33;
  _Tuple_impl<1UL,_int,_int> _Var34;
  _Tuple_impl<1UL,_int,_int> _Var35;
  bool bVar36;
  string m;
  string n;
  string __str;
  string __str_1;
  uint __uval;
  string __str_3;
  string __str_2;
  string __str_7;
  string __str_6;
  string __str_5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ors;
  string __str_4;
  _Tuple_impl<1UL,_int,_int> local_218;
  undefined1 local_210 [8];
  _Tuple_impl<1UL,_int,_int> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Tuple_impl<1UL,_int,_int> local_1f0;
  Proof *local_1e8;
  undefined1 local_1e0 [8];
  _Tuple_impl<1UL,_int,_int> local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  uint local_160;
  uint local_15c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  uint local_138;
  uint local_134;
  size_type local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  uint local_e4;
  _Tuple_impl<1UL,_int,_int> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 *puVar30;
  
  _Var9.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  _Var9.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)p;
  local_1f0 = (_Tuple_impl<1UL,_int,_int>)adj;
  local_138 = t;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50,
             "* selected vertices must be connected, walk 1\n",0x2e);
  local_1e8 = this;
  local_160 = p;
  local_e0 = _Var9;
  if (0 < p) {
    _Var9 = (_Tuple_impl<1UL,_int,_int>)(long)(int)local_138;
    _Var35.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         (_Head_base<2UL,_int,_false>)0x0;
    _Var35.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
    do {
      if (_Var35 != (_Tuple_impl<1UL,_int,_int>)0x0) {
        _Var28.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (_Head_base<2UL,_int,_false>)0x0;
        _Var28.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
        do {
          uVar32 = 1;
          _Var7 = _Var35.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
          if (9 < (ulong)_Var35) {
            uVar27 = 4;
            _Var16 = _Var35;
            do {
              uVar32 = uVar27;
              _Var5 = _Var16.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                      _M_head_impl;
              if ((uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                uVar32 = uVar32 - 2;
                goto LAB_00122b47;
              }
              if ((uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                uVar32 = uVar32 - 1;
                goto LAB_00122b47;
              }
              if ((uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
              goto LAB_00122b47;
              _Var16 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var16 & 0xffffffff) / 10000);
              uVar27 = uVar32 + 4;
            } while (99999 < (uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl);
            uVar32 = uVar32 + 1;
          }
LAB_00122b47:
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_1a0,(ulong)uVar32,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_1a0._M_dataplus._M_p,uVar32,
                     (uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl);
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_1a0,0,0,"conn1_",6);
          local_1e0 = (undefined1  [8])&local_1d0;
          paVar17 = &pbVar10->field_2;
          _Var22 = (_Tuple_impl<2UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
          if (_Var22 == (_Tuple_impl<2UL,_int,_int>)paVar17) {
            local_1d0._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_1d0._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_1d0._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_1e0 = (undefined1  [8])_Var22;
          }
          local_1d8 = (_Tuple_impl<1UL,_int,_int>)pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e0,"_");
          local_210 = (undefined1  [8])&local_200;
          paVar17 = &pbVar10->field_2;
          _Var16 = (_Tuple_impl<1UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
          if (_Var16 == (_Tuple_impl<1UL,_int,_int>)paVar17) {
            local_200._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_200._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_200._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_210 = (undefined1  [8])_Var16;
          }
          local_208 = (_Tuple_impl<1UL,_int,_int>)pbVar10->_M_string_length;
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          uVar32 = 1;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          _Var20._M_head_impl =
               (int)_Var28.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                    _M_head_impl;
          if (9 < (ulong)_Var28) {
            uVar27 = 4;
            _Var16 = _Var28;
            do {
              uVar32 = uVar27;
              _Var5 = _Var16.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                      _M_head_impl;
              if ((uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                uVar32 = uVar32 - 2;
                goto LAB_00122c89;
              }
              if ((uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                uVar32 = uVar32 - 1;
                goto LAB_00122c89;
              }
              if ((uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
              goto LAB_00122c89;
              _Var16 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var16 & 0xffffffff) / 10000);
              uVar27 = uVar32 + 4;
            } while (99999 < (uint)_Var5.super__Head_base<2UL,_int,_false>._M_head_impl);
            uVar32 = uVar32 + 1;
          }
LAB_00122c89:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_180,(ulong)uVar32,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_180._M_dataplus._M_p,uVar32,_Var20._M_head_impl);
          pPVar2 = local_1e8;
          uVar26 = 0xf;
          if (local_210 != (undefined1  [8])&local_200) {
            uVar26 = local_200._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_180._M_string_length + (long)local_208) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              uVar26 = local_180.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_180._M_string_length + (long)local_208) goto LAB_00122d14;
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_180,0,0,(char *)local_210,(size_type)local_208);
          }
          else {
LAB_00122d14:
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_210,local_180._M_dataplus._M_p,local_180._M_string_length)
            ;
          }
          paVar17 = &pbVar10->field_2;
          local_1c0._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p == paVar17) {
            local_1c0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          }
          else {
            local_1c0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          }
          local_1c0._M_string_length = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar10->_M_string_length = 0;
          paVar17->_M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if (local_210 != (undefined1  [8])&local_200) {
            operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
          }
          if (local_1e0 != (undefined1  [8])&local_1d0) {
            operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          local_208.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
               (_Head_base<2UL,_int,_false>)0x1;
          local_210._0_4_ = _Var20._M_head_impl;
          local_210._4_4_ = _Var7.super__Head_base<2UL,_int,_false>._M_head_impl;
          std::
          _Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::tuple<int,int,int>,std::__cxx11::string&>
                    ((_Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
                      *)&((pPVar2->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         connected_variable_mappings,(tuple<int,_int,_int> *)local_210,&local_1c0);
          local_210._0_4_ = _Var7.super__Head_base<2UL,_int,_false>._M_head_impl;
          local_1e0._0_4_ = _Var20._M_head_impl;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_1f0 + 0x10))->_M_allocated_capacity == 0) {
            std::__throw_bad_function_call();
          }
          cVar4 = (**(code **)((long)local_1f0 + 0x18))(local_1f0,local_210,local_1e0);
          poVar11 = (ostream *)
                    &((local_1e8->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     field_0x50;
          if (cVar4 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 ~x",4);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            lVar21 = 1;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 ~x",4);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
            local_210 = (undefined1  [8])_Var35;
            local_208 = _Var9;
            pmVar12 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_210);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
            poVar11 = (ostream *)
                      &((local_1e8->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 ~x",4);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
            local_210 = (undefined1  [8])_Var28;
            local_208 = _Var9;
            pmVar12 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_210);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
            poVar11 = (ostream *)
                      &((local_1e8->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 x",3);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 x",4);
            local_210 = (undefined1  [8])_Var35;
            local_208 = _Var9;
            pmVar12 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_210);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 x",4);
            local_1e0 = (undefined1  [8])_Var28;
            local_1d8 = _Var9;
            pmVar12 = std::
                      map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((local_1e8->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->variable_mappings,(key_type *)local_1e0);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
            lVar21 = 3;
          }
          this = local_1e8;
          plVar1 = &((local_1e8->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    nb_constraints;
          *plVar1 = *plVar1 + lVar21;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          _Var28 = (_Tuple_impl<1UL,_int,_int>)((long)_Var28 + 1);
        } while (_Var28 != _Var35);
      }
      _Var35 = (_Tuple_impl<1UL,_int,_int>)((long)_Var35 + 1);
    } while (_Var35 != local_e0);
  }
  uVar32 = 2;
  local_e4 = local_160;
  if ((int)local_138 < (int)local_160) {
    local_e4 = local_138;
  }
  do {
    poVar11 = (ostream *)
              &((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"* selected vertices must be connected, walk ",0x2c);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,uVar32);
    local_1c0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_1c0,1);
    if ((int)local_160 < 1) {
      if ((int)local_e4 <= (int)uVar32) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   &((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    field_0x50,"* if two vertices are used, they must be connected\n",0x33);
        return;
      }
    }
    else {
      local_15c = -uVar32;
      if (0 < (int)uVar32) {
        local_15c = uVar32;
      }
      uVar25 = (ulong)local_15c;
      uVar19 = (ulong)(uVar32 >> 0x1f);
      local_130 = (size_type)((int)uVar32 >> 1);
      _Var16.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           (_Head_base<2UL,_int,_false>)0x0;
      _Var16.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
      local_134 = uVar32;
      local_58 = uVar19;
      do {
        local_1f0 = _Var16;
        if (_Var16 != (_Tuple_impl<1UL,_int,_int>)0x0) {
          local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
               (_Head_base<2UL,_int,_false>)0x0;
          local_218.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
          do {
            uVar27 = 1;
            uVar32 = (uint)uVar25;
            if (9 < uVar32) {
              uVar8 = 4;
              do {
                uVar27 = uVar8;
                uVar6 = (uint)uVar25;
                if (uVar6 < 100) {
                  uVar27 = uVar27 - 2;
                  goto LAB_001231f2;
                }
                if (uVar6 < 1000) {
                  uVar27 = uVar27 - 1;
                  goto LAB_001231f2;
                }
                if (uVar6 < 10000) goto LAB_001231f2;
                uVar25 = uVar25 / 10000;
                uVar8 = uVar27 + 4;
              } while (99999 < uVar6);
              uVar27 = uVar27 + 1;
            }
LAB_001231f2:
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_108,(ulong)((int)uVar19 + uVar27),'-');
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_108._M_dataplus._M_p + uVar19,uVar27,uVar32);
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_108,0,0,"conn",4);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            paVar18 = &pbVar10->field_2;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar10->_M_dataplus)._M_p;
            if (paVar17 == paVar18) {
              local_180.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_180.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_180._M_dataplus._M_p = (pointer)paVar17;
            }
            local_180._M_string_length = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_180,"_");
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            paVar17 = &pbVar10->field_2;
            _Var22 = (_Tuple_impl<2UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
            if (_Var22 == (_Tuple_impl<2UL,_int,_int>)paVar17) {
              local_1a0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1a0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_1a0._M_dataplus._M_p = (pointer)_Var22;
            }
            local_1a0._M_string_length = pbVar10->_M_string_length;
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            uVar32 = 1;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            if (9 < (ulong)local_1f0) {
              _Var9 = local_1f0;
              uVar27 = 4;
              do {
                uVar32 = uVar27;
                _Var7 = _Var9.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                        _M_head_impl;
                if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                  uVar32 = uVar32 - 2;
                  goto LAB_0012335e;
                }
                if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                  uVar32 = uVar32 - 1;
                  goto LAB_0012335e;
                }
                if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                goto LAB_0012335e;
                _Var9 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var9 & 0xffffffff) / 10000);
                uVar27 = uVar32 + 4;
              } while (99999 < (uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl);
              uVar32 = uVar32 + 1;
            }
LAB_0012335e:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_158,(ulong)uVar32,'-');
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_158._M_dataplus._M_p,uVar32,
                       (uint)local_1f0.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>
                             ._M_head_impl.super__Head_base<2UL,_int,_false>);
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              uVar26 = local_1a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_158._M_string_length + local_1a0._M_string_length) {
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                uVar26 = local_158.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 < local_158._M_string_length + local_1a0._M_string_length)
              goto LAB_001233ed;
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  (&local_158,0,0,local_1a0._M_dataplus._M_p,
                                   local_1a0._M_string_length);
            }
            else {
LAB_001233ed:
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_1a0,local_158._M_dataplus._M_p,local_158._M_string_length)
              ;
            }
            local_1e0 = (undefined1  [8])&local_1d0;
            paVar17 = &pbVar10->field_2;
            _Var9 = (_Tuple_impl<1UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
            if (_Var9 == (_Tuple_impl<1UL,_int,_int>)paVar17) {
              local_1d0._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_1d0._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1d0._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_1e0 = (undefined1  [8])_Var9;
            }
            local_1d8 = (_Tuple_impl<1UL,_int,_int>)pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            paVar17->_M_local_buf[0] = '\0';
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1e0,"_");
            local_210 = (undefined1  [8])&local_200;
            paVar17 = &pbVar10->field_2;
            _Var9 = (_Tuple_impl<1UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
            if (_Var9 == (_Tuple_impl<1UL,_int,_int>)paVar17) {
              local_200._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_200._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_200._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_210 = (undefined1  [8])_Var9;
            }
            local_208 = (_Tuple_impl<1UL,_int,_int>)pbVar10->_M_string_length;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            uVar32 = 1;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            if (9 < (ulong)local_218) {
              _Var9 = local_218;
              uVar27 = 4;
              do {
                uVar32 = uVar27;
                _Var7 = _Var9.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                        _M_head_impl;
                if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                  uVar32 = uVar32 - 2;
                  goto LAB_00123500;
                }
                if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                  uVar32 = uVar32 - 1;
                  goto LAB_00123500;
                }
                if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                goto LAB_00123500;
                _Var9 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var9 & 0xffffffff) / 10000);
                uVar27 = uVar32 + 4;
              } while (99999 < (uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl);
              uVar32 = uVar32 + 1;
            }
LAB_00123500:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_128,(ulong)uVar32,'-');
            _Var20._M_head_impl =
                 (int)local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                      _M_head_impl;
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_128._M_dataplus._M_p,uVar32,_Var20._M_head_impl);
            uVar32 = local_134;
            uVar26 = 0xf;
            if (local_210 != (undefined1  [8])&local_200) {
              uVar26 = local_200._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_128._M_string_length + (long)local_208) {
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                uVar26 = local_128.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 < local_128._M_string_length + (long)local_208) goto LAB_0012358c;
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  (&local_128,0,0,(char *)local_210,(size_type)local_208);
            }
            else {
LAB_0012358c:
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_210,local_128._M_dataplus._M_p,
                                   local_128._M_string_length);
            }
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            paVar17 = &pbVar10->field_2;
            _Var9 = (_Tuple_impl<1UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
            if (_Var9 == (_Tuple_impl<1UL,_int,_int>)paVar17) {
              local_1c0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_1c0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_1c0._M_dataplus._M_p = (pointer)_Var9;
            }
            local_1c0._M_string_length = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar10->_M_string_length = 0;
            paVar17->_M_local_buf[0] = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_210 != (undefined1  [8])&local_200) {
              operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
            }
            if (local_1e0 != (undefined1  [8])&local_1d0) {
              operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            local_210._4_4_ =
                 (_Head_base<2UL,_int,_false>)
                 local_1f0.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_210._0_4_ = _Var20._M_head_impl;
            local_208.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                 (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)uVar32;
            std::
            _Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::tuple<int,int,int>,std::__cxx11::string&>
                      ((_Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
                        *)&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->connected_variable_mappings,(tuple<int,_int,_int> *)local_210,
                       &local_1c0);
            __val._M_head_impl = 0;
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Var9 = local_1f0;
            uVar32 = local_15c;
            do {
              uVar19 = local_58;
              _Var13.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
              _Var13.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                   (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)__val._M_head_impl;
              if (local_218 != _Var13 && _Var9 != _Var13) {
                uVar27 = 1;
                if (9 < uVar32) {
                  uVar25 = (ulong)uVar32;
                  uVar32 = 4;
                  do {
                    uVar27 = uVar32;
                    uVar8 = (uint)uVar25;
                    if (uVar8 < 100) {
                      uVar27 = uVar27 - 2;
                      goto LAB_001237a0;
                    }
                    if (uVar8 < 1000) {
                      uVar27 = uVar27 - 1;
                      goto LAB_001237a0;
                    }
                    if (uVar8 < 10000) goto LAB_001237a0;
                    uVar25 = uVar25 / 10000;
                    uVar32 = uVar27 + 4;
                  } while (99999 < uVar8);
                  uVar27 = uVar27 + 1;
                }
LAB_001237a0:
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_50,(ulong)((int)local_58 + uVar27),'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_50._M_dataplus._M_p + uVar19,uVar27,local_15c);
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (&local_50,0,0,"conn",4);
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                paVar18 = &pbVar10->field_2;
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar10->_M_dataplus)._M_p;
                if (paVar17 == paVar18) {
                  local_128.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_128.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                }
                else {
                  local_128.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_128._M_dataplus._M_p = (pointer)paVar17;
                }
                local_128._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar18;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_128,"_");
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                paVar18 = &pbVar10->field_2;
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar10->_M_dataplus)._M_p;
                if (paVar17 == paVar18) {
                  local_158.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                }
                else {
                  local_158.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_158._M_dataplus._M_p = (pointer)paVar17;
                }
                local_158._M_string_length = pbVar10->_M_string_length;
                uVar32 = 1;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar18;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                if (9 < (ulong)local_1f0) {
                  uVar27 = 4;
                  _Var9 = local_1f0;
                  do {
                    uVar32 = uVar27;
                    _Var7 = _Var9.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                            _M_head_impl;
                    if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                      uVar32 = uVar32 - 2;
                      goto LAB_00123919;
                    }
                    if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                      uVar32 = uVar32 - 1;
                      goto LAB_00123919;
                    }
                    if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                    goto LAB_00123919;
                    _Var9 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var9 & 0xffffffff) / 10000);
                    uVar27 = uVar32 + 4;
                  } while (99999 < (uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl);
                  uVar32 = uVar32 + 1;
                }
LAB_00123919:
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_98,(ulong)uVar32,'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_98._M_dataplus._M_p,uVar32,
                           (uint)local_1f0.super__Tuple_impl<2UL,_int>.
                                 super__Head_base<2UL,_int,_false>._M_head_impl.
                                 super__Head_base<2UL,_int,_false>);
                uVar26 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  uVar26 = local_158.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar26 < local_98._M_string_length + local_158._M_string_length) {
                  uVar26 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    uVar26 = local_98.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar26 < local_98._M_string_length + local_158._M_string_length)
                  goto LAB_001239b5;
                  pbVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_98,0,0,local_158._M_dataplus._M_p,
                                    local_158._M_string_length);
                }
                else {
LAB_001239b5:
                  pbVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append(&local_158,local_98._M_dataplus._M_p,local_98._M_string_length
                                     );
                }
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                paVar17 = &pbVar10->field_2;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar10->_M_dataplus)._M_p;
                if (paVar18 == paVar17) {
                  local_108.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                }
                else {
                  local_108.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_108._M_dataplus._M_p = (pointer)paVar18;
                }
                local_108._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
                pbVar10->_M_string_length = 0;
                paVar17->_M_local_buf[0] = '\0';
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_108,"_");
                local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
                paVar18 = &pbVar10->field_2;
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar10->_M_dataplus)._M_p;
                if (paVar17 == paVar18) {
                  local_180.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                }
                else {
                  local_180.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_180._M_dataplus._M_p = (pointer)paVar17;
                }
                local_180._M_string_length = pbVar10->_M_string_length;
                uVar32 = 1;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar18;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                if (9 < (ulong)local_218) {
                  _Var9 = local_218;
                  uVar27 = 4;
                  do {
                    uVar32 = uVar27;
                    _Var7 = _Var9.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                            _M_head_impl;
                    if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 100) {
                      uVar32 = uVar32 - 2;
                      goto LAB_00123aea;
                    }
                    if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 1000) {
                      uVar32 = uVar32 - 1;
                      goto LAB_00123aea;
                    }
                    if ((uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl < 10000)
                    goto LAB_00123aea;
                    _Var9 = (_Tuple_impl<1UL,_int,_int>)(((ulong)_Var9 & 0xffffffff) / 10000);
                    uVar27 = uVar32 + 4;
                  } while (99999 < (uint)_Var7.super__Head_base<2UL,_int,_false>._M_head_impl);
                  uVar32 = uVar32 + 1;
                }
LAB_00123aea:
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_b8,(ulong)uVar32,'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_b8._M_dataplus._M_p,uVar32,_Var20._M_head_impl);
                uVar26 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  uVar26 = local_180.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar26 < local_b8._M_string_length + local_180._M_string_length) {
                  uVar26 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    uVar26 = local_b8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar26 < local_b8._M_string_length + local_180._M_string_length)
                  goto LAB_00123b85;
                  pbVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_b8,0,0,local_180._M_dataplus._M_p,
                                    local_180._M_string_length);
                }
                else {
LAB_00123b85:
                  pbVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append(&local_180,local_b8._M_dataplus._M_p,local_b8._M_string_length
                                     );
                }
                local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
                paVar17 = &pbVar10->field_2;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar10->_M_dataplus)._M_p;
                if (paVar18 == paVar17) {
                  local_1a0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                }
                else {
                  local_1a0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_1a0._M_dataplus._M_p = (pointer)paVar18;
                }
                local_1a0._M_string_length = pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
                pbVar10->_M_string_length = 0;
                paVar17->_M_local_buf[0] = '\0';
                pbVar10 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_1a0,"_via_");
                local_1e0 = (undefined1  [8])&local_1d0;
                paVar17 = &pbVar10->field_2;
                _Var22 = (_Tuple_impl<2UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
                if (_Var22 == (_Tuple_impl<2UL,_int,_int>)paVar17) {
                  local_1d0._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_1d0._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                }
                else {
                  local_1d0._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_1e0 = (undefined1  [8])_Var22;
                }
                local_1d8 = (_Tuple_impl<1UL,_int,_int>)pbVar10->_M_string_length;
                uVar32 = 1;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
                pbVar10->_M_string_length = 0;
                (pbVar10->field_2)._M_local_buf[0] = '\0';
                if (9 < (uint)__val._M_head_impl) {
                  uVar19 = (ulong)(uint)__val._M_head_impl;
                  uVar27 = 4;
                  do {
                    uVar32 = uVar27;
                    uVar8 = (uint)uVar19;
                    if (uVar8 < 100) {
                      uVar32 = uVar32 - 2;
                      goto LAB_00123ca2;
                    }
                    if (uVar8 < 1000) {
                      uVar32 = uVar32 - 1;
                      goto LAB_00123ca2;
                    }
                    if (uVar8 < 10000) goto LAB_00123ca2;
                    uVar19 = uVar19 / 10000;
                    uVar27 = uVar32 + 4;
                  } while (99999 < uVar8);
                  uVar32 = uVar32 + 1;
                }
LAB_00123ca2:
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_d8,(ulong)uVar32,'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_d8._M_dataplus._M_p,uVar32,__val._M_head_impl);
                uVar26 = 0xf;
                if (local_1e0 != (undefined1  [8])&local_1d0) {
                  uVar26 = local_1d0._M_allocated_capacity;
                }
                if ((ulong)uVar26 < local_d8._M_string_length + (long)local_1d8) {
                  uVar26 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                    uVar26 = local_d8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar26 < local_d8._M_string_length + (long)local_1d8)
                  goto LAB_00123d2f;
                  pbVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            replace(&local_d8,0,0,(char *)local_1e0,(size_type)local_1d8);
                }
                else {
LAB_00123d2f:
                  pbVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1e0,local_d8._M_dataplus._M_p,
                                      local_d8._M_string_length);
                }
                local_210 = (undefined1  [8])&local_200;
                paVar17 = &pbVar10->field_2;
                _Var9 = (_Tuple_impl<1UL,_int,_int>)(pbVar10->_M_dataplus)._M_p;
                if (_Var9 == (_Tuple_impl<1UL,_int,_int>)paVar17) {
                  local_200._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_200._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                }
                else {
                  local_200._M_allocated_capacity = paVar17->_M_allocated_capacity;
                  local_210 = (undefined1  [8])_Var9;
                }
                local_208 = (_Tuple_impl<1UL,_int,_int>)pbVar10->_M_string_length;
                (pbVar10->_M_dataplus)._M_p = (pointer)paVar17;
                pbVar10->_M_string_length = 0;
                paVar17->_M_local_buf[0] = '\0';
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                if (local_1e0 != (undefined1  [8])&local_1d0) {
                  operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                  operator_delete(local_1a0._M_dataplus._M_p,
                                  local_1a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  operator_delete(local_180._M_dataplus._M_p,
                                  local_180.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  local_98.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_dataplus._M_p != &local_128.field_2) {
                  operator_delete(local_128._M_dataplus._M_p,
                                  local_128.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_78,(value_type *)local_210);
                pPVar2 = local_1e8;
                local_1e0._4_4_ = _Var20._M_head_impl;
                local_1e0._0_4_ = __val._M_head_impl;
                local_1d8 = (_Tuple_impl<1UL,_int,_int>)
                            CONCAT44(local_134,
                                     local_1f0.super__Tuple_impl<2UL,_int>.
                                     super__Head_base<2UL,_int,_false>._M_head_impl.
                                     super__Head_base<2UL,_int,_false>);
                std::
                _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::tuple<int,int,int,int>,std::__cxx11::string&>
                          ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>>
                            *)&((local_1e8->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->connected_variable_mappings_aux,
                           (tuple<int,_int,_int,_int> *)local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_210);
                poVar11 = (ostream *)
                          &((pPVar2->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->field_0x50;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 x",3);
                _Var34.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
                _Var34.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                     (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)__val._M_head_impl;
                bVar36 = (uint)local_1f0.super__Tuple_impl<2UL,_int>.
                               super__Head_base<2UL,_int,_false>._M_head_impl.
                               super__Head_base<2UL,_int,_false> < (uint)__val._M_head_impl;
                if (bVar36) {
                  _Var34 = (_Tuple_impl<1UL,_int,_int>)((ulong)local_1f0 & 0xffffffff);
                }
                _Var33 = (_Tuple_impl<1UL,_int,_int>)((ulong)local_1f0 & 0xffffffff);
                if (bVar36) {
                  _Var33.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
                  _Var33.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl
                       = (_Head_base<2UL,_int,_false>)
                         (_Head_base<2UL,_int,_false>)__val._M_head_impl;
                }
                local_1d0._M_allocated_capacity = local_130;
                local_1e0 = (undefined1  [8])_Var34;
                local_1d8 = _Var33;
                pmVar14 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)local_1e0);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(pmVar14->_M_dataplus)._M_p,pmVar14->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)local_210,(long)local_208);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
                poVar11 = (ostream *)
                          &((local_1e8->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->field_0x50;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 x",3);
                _Var22.super__Head_base<2UL,_int,_false>._M_head_impl = 0;
                _Var22.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                     (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)__val._M_head_impl;
                if ((uint)_Var20._M_head_impl < (uint)__val._M_head_impl) {
                  _Var22 = (_Tuple_impl<2UL,_int,_int>)((ulong)local_218 & 0xffffffff);
                }
                uVar19 = (ulong)local_218 & 0xffffffff;
                if ((uint)_Var20._M_head_impl < (uint)__val._M_head_impl) {
                  uVar19 = (ulong)(uint)__val._M_head_impl;
                }
                local_1d0._M_allocated_capacity = local_130;
                local_1e0 = (undefined1  [8])_Var22;
                local_1d8 = (_Tuple_impl<1UL,_int,_int>)uVar19;
                pmVar14 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)local_1e0);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(pmVar14->_M_dataplus)._M_p,pmVar14->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)local_210,(long)local_208);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
                poVar11 = (ostream *)
                          &((local_1e8->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->field_0x50;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 x",3);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(char *)local_210,(long)local_208);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
                local_1d0._M_allocated_capacity = local_130;
                local_1e0 = (undefined1  [8])_Var34;
                local_1d8 = _Var33;
                pmVar14 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)local_1e0);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(pmVar14->_M_dataplus)._M_p,pmVar14->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
                this = local_1e8;
                local_1a0.field_2._M_allocated_capacity = local_130;
                local_1a0._M_dataplus._M_p = (pointer)_Var22;
                local_1a0._M_string_length = uVar19;
                pmVar14 = std::
                          map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((local_1e8->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->connected_variable_mappings,
                                       (key_type *)&local_1a0);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(pmVar14->_M_dataplus)._M_p,pmVar14->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
                plVar1 = &((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          nb_constraints;
                *plVar1 = *plVar1 + 3;
                _Var9 = local_1f0;
                uVar32 = local_15c;
                if (local_210 != (undefined1  [8])&local_200) {
                  operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
                  _Var9 = local_1f0;
                  uVar32 = local_15c;
                }
              }
              __val._M_head_impl = __val._M_head_impl + 1;
            } while (__val._M_head_impl != local_160);
            poVar11 = (ostream *)
                      &((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1 ~x",4);
            uVar32 = local_134;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            pbVar3 = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar23 = local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar3;
                pbVar23 = pbVar23 + 1) {
              poVar11 = (ostream *)
                        &((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         field_0x50;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 x",4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length);
            }
            poVar11 = (ostream *)
                      &((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 x",4);
            local_210._0_4_ =
                 local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_210._4_4_ = local_218.super__Head_base<1UL,_int,_false>._M_head_impl;
            local_208 = local_1f0;
            local_200._M_allocated_capacity = local_130;
            pmVar14 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,(key_type *)local_210
                                  );
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(pmVar14->_M_dataplus)._M_p,pmVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        field_0x50," >= 1 ;\n",8);
            pbVar3 = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            _Var29._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
            (_Var29._M_head_impl)->nb_constraints = (_Var29._M_head_impl)->nb_constraints + 1;
            for (pbVar23 = local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                puVar30 = &(_Var29._M_head_impl)->field_0x50, pbVar23 != pbVar3;
                pbVar23 = pbVar23 + 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar30,"1 x",3);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar30,local_1c0._M_dataplus._M_p,
                                   local_1c0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
              _Var29._M_head_impl =
                   (this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
              (_Var29._M_head_impl)->nb_constraints = (_Var29._M_head_impl)->nb_constraints + 1;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar30,"1 x",3);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar30,local_1c0._M_dataplus._M_p,
                                 local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 ~x",5);
            local_210._0_4_ =
                 local_218.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                 _M_head_impl;
            local_210._4_4_ = local_218.super__Head_base<1UL,_int,_false>._M_head_impl;
            local_208 = local_1f0;
            local_200._M_allocated_capacity = local_130;
            pmVar14 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,(key_type *)local_210
                                  );
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(pmVar14->_M_dataplus)._M_p,pmVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," >= 1 ;\n",8);
            plVar1 = &((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      nb_constraints;
            *plVar1 = *plVar1 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar25 = (ulong)local_15c;
            local_218 = (_Tuple_impl<1UL,_int,_int>)((long)local_218 + 1);
            uVar19 = local_58;
          } while (local_218 != local_1f0);
        }
        _Var16 = (_Tuple_impl<1UL,_int,_int>)((long)local_1f0 + 1);
      } while (_Var16 != local_e0);
      if ((int)local_e4 <= (int)uVar32) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   &((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    field_0x50,"* if two vertices are used, they must be connected\n",0x33);
        pPVar2 = local_1e8;
        if (0 < (int)local_160) {
          local_1f0 = (_Tuple_impl<1UL,_int,_int>)(long)(int)local_138;
          _Var24.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
               (_Head_base<2UL,_int,_false>)0x0;
          _Var24.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
          do {
            if (_Var24 != (_Tuple_impl<1UL,_int,_int>)0x0) {
              _Var29._M_head_impl =
                   (pPVar2->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
              _Var31.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                   (_Head_base<2UL,_int,_false>)0x0;
              _Var31.super__Head_base<1UL,_int,_false>._M_head_impl = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&(_Var29._M_head_impl)->field_0x50,"1 x",3);
                _Var9 = local_1f0;
                local_1c0._M_string_length._0_4_ =
                     local_1f0.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                     _M_head_impl;
                local_1c0._M_string_length._4_4_ =
                     local_1f0.super__Head_base<1UL,_int,_false>._M_head_impl;
                local_1c0._M_dataplus._M_p = (pointer)_Var24;
                pmVar12 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((pPVar2->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_1c0);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(_Var29._M_head_impl)->field_0x50,
                                     (pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," 1 x",4);
                local_208 = _Var9;
                local_210 = (undefined1  [8])_Var31;
                pmVar12 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((pPVar2->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)local_210);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
                local_1c0._M_dataplus._M_p = (pointer)_Var31;
                local_1c0._M_string_length = (size_type)_Var24;
                local_1c0.field_2._M_allocated_capacity = (long)(int)uVar32;
                iVar15 = std::
                         _Rb_tree<std::tuple<long,_long,_long>,_std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::find(&(((pPVar2->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                  _M_head_impl)->connected_variable_mappings)._M_t,
                                (key_type *)&local_1c0);
                _Var29._M_head_impl =
                     (pPVar2->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                if ((_Rb_tree_header *)iVar15._M_node !=
                    (_Rb_tree_header *)
                    ((long)&(_Var29._M_head_impl)->connected_variable_mappings + 8U)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&(_Var29._M_head_impl)->field_0x50," 1 x",4);
                  local_1c0._M_dataplus._M_p = (pointer)_Var31;
                  local_1c0._M_string_length = (size_type)_Var24;
                  local_1c0.field_2._M_allocated_capacity = (long)(int)uVar32;
                  pmVar14 = std::
                            map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&((pPVar2->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>
                                          ._M_head_impl)->connected_variable_mappings,
                                         (key_type *)&local_1c0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&(_Var29._M_head_impl)->field_0x50,
                             (pmVar14->_M_dataplus)._M_p,pmVar14->_M_string_length);
                  _Var29._M_head_impl =
                       (pPVar2->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&(_Var29._M_head_impl)->field_0x50," >= 1 ;\n",8);
                _Var29._M_head_impl =
                     (pPVar2->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                _Var31 = (_Tuple_impl<1UL,_int,_int>)((long)_Var31 + 1);
                (_Var29._M_head_impl)->nb_constraints = (_Var29._M_head_impl)->nb_constraints + 1;
              } while (_Var24 != _Var31);
            }
            _Var24 = (_Tuple_impl<1UL,_int,_int>)((long)_Var24 + 1);
          } while (_Var24 != local_e0);
        }
        return;
      }
    }
    uVar32 = uVar32 * 2;
  } while( true );
}

Assistant:

auto Proof::create_connected_constraints(int p, int t, const function<auto(int, int)->bool> & adj) -> void
{
    _imp->model_stream << "* selected vertices must be connected, walk 1\n";
    int mapped_to_null = t;
    int cnum = _imp->variable_mappings.size();

    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            string n = "conn1_" + to_string(v) + "_" + to_string(w);
            _imp->connected_variable_mappings.emplace(tuple{1, v, w}, n);
            if (! adj(v, w)) {
                // v not adjacent to w, so the walk does not exist
                _imp->model_stream << "1 ~x" << n << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }
            else {
                // v = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{v, mapped_to_null}] << " >= 1 ;\n";
                // w = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                // either v = null, or w = null, or the walk exists
                _imp->model_stream << "1 x" << n << " 1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                                   << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                _imp->nb_constraints += 3;
            }
        }

    int last_k = 0;
    for (int k = 2 ; ; k *= 2) {
        last_k = k;
        _imp->model_stream << "* selected vertices must be connected, walk " << k << '\n';
        for (int v = 0; v < p; ++v)
            for (int w = 0; w < v; ++w) {
                string n = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w);
                _imp->connected_variable_mappings.emplace(tuple{k, v, w}, n);

                vector<string> ors;
                for (int u = 0; u < p; ++u) {
                    if (v != w && v != u && u != w) {
                        string m = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w) + "_via_" + to_string(u);
                        ors.push_back(m);
                        _imp->connected_variable_mappings_aux.emplace(tuple{k, v, w, u}, m);
                        // either the first half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, v), min(u, v)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // either the second half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // one of the half walks is false, or the via term must be true
                        _imp->model_stream << "1 x" << m
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(v, u), min(v, u)}]
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}] << " >= 1 ;\n";
                        _imp->nb_constraints += 3;
                    }
                }

                // one of the vias must be true, or a shorter walk exists, or the entry is false
                _imp->model_stream << "1 ~x" << n;
                for (auto & o : ors)
                    _imp->model_stream << " 1 x" << o;
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}];
                _imp->model_stream << " >= 1 ;\n";
                ++_imp->nb_constraints;

                // if the entry is false, then all of the vias must be false and the shorter walk must be false
                for (auto & o : ors) {
                    _imp->model_stream << "1 x" << n << " 1 ~x" << o << " >= 1 ;\n";
                    ++_imp->nb_constraints;
                }
                _imp->model_stream << "1 x" << n << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}] << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }

        if (k >= min(p, t))
            break;
    }

    _imp->model_stream << "* if two vertices are used, they must be connected\n";
    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            _imp->model_stream << "1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                               << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}];
            auto var = _imp->connected_variable_mappings.find(tuple{last_k, v, w});
            if (var != _imp->connected_variable_mappings.end())
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{last_k, v, w}];
            _imp->model_stream << " >= 1 ;\n";
            ++_imp->nb_constraints;
        }
}